

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

void __thiscall xe::ri::Shader::~Shader(Shader *this)

{
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__Shader_0011c7c8;
  InfoLog::~InfoLog(&this->infoLog);
  ShaderSource::~ShaderSource(&this->source);
  return;
}

Assistant:

~Shader				(void) {}